

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ypspur-interpreter.c
# Opt level: O3

void print_help(char **argv)

{
  fprintf(_stderr,"USAGE: %s\n",*argv);
  fputs("\t-V | --set-vel      VALUE    : [m/s]   set max vel of SPUR to VALUE\n",_stderr);
  fputs("\t-W | --set-angvel   VALUE    : [rad/s] set max angvel of SPUR to VALUE\n",_stderr);
  fputs("\t-A | --set-accel    VALUE    : [m/ss]   set accel of SPUR to VALUE\n",_stderr);
  fputs("\t-O | --set-angaccel VALUE    : [rad/ss] set angaccel of SPUR to VALUE\n",_stderr);
  fputs("\t-c | --command     \"VALUE\"   : execute command VALUE\n",_stderr);
  fputs("\t-q | --msq-id       VALUE    : set message-queue id\n",_stderr);
  fputs("\t-s | --socket       IP:PORT  : use socket ipc\n",_stderr);
  fputs("\t-h | --help                  : print this help\n",_stderr);
  return;
}

Assistant:

void print_help(char* argv[])
{
  fprintf(stderr, "USAGE: %s\n", argv[0]);
  fputs("\t-V | --set-vel      VALUE    : [m/s]   set max vel of SPUR to VALUE\n", stderr);
  fputs("\t-W | --set-angvel   VALUE    : [rad/s] set max angvel of SPUR to VALUE\n", stderr);
  fputs("\t-A | --set-accel    VALUE    : [m/ss]   set accel of SPUR to VALUE\n", stderr);
  fputs("\t-O | --set-angaccel VALUE    : [rad/ss] set angaccel of SPUR to VALUE\n", stderr);
  fputs("\t-c | --command     \"VALUE\"   : execute command VALUE\n", stderr);
  fputs("\t-q | --msq-id       VALUE    : set message-queue id\n", stderr);
  fputs("\t-s | --socket       IP:PORT  : use socket ipc\n", stderr);
  fputs("\t-h | --help                  : print this help\n", stderr);
}